

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.hpp
# Opt level: O1

void __thiscall duckdb::Bit::BitToNumeric<float>(Bit *this,bitstring_t bit,float *output_num)

{
  undefined4 uVar1;
  uint8_t uVar2;
  undefined4 *puVar3;
  char *pcVar4;
  ulong uVar5;
  anon_union_16_2_67f50693_for_value local_28;
  
  puVar3 = bit.value._8_8_;
  *puVar3 = 0;
  local_28.pointer.length = (uint32_t)this;
  uVar1 = local_28.pointer.length;
  uVar5 = (ulong)this & 0xffffffff;
  local_28._0_8_ = this;
  local_28.pointer.ptr = bit.value._0_8_;
  uVar2 = GetFirstByte((bitstring_t *)&local_28.pointer);
  *(uint8_t *)((long)puVar3 + (uVar5 - 2)) = uVar2;
  if (6 - uVar5 < 4) {
    pcVar4 = bit.value._0_8_;
    if ((uint)uVar1 < 0xd) {
      pcVar4 = local_28.pointer.prefix;
    }
    pcVar4 = pcVar4 + 2;
    do {
      *(char *)((long)puVar3 + (uVar5 - 3)) = *pcVar4;
      uVar5 = uVar5 - 1;
      pcVar4 = pcVar4 + 1;
    } while (uVar5 != 2);
  }
  return;
}

Assistant:

void Bit::BitToNumeric(bitstring_t bit, T &output_num) {
	D_ASSERT(bit.GetSize() <= sizeof(T) + 1);

	output_num = 0;
	auto data = const_data_ptr_cast(bit.GetData());
	auto output = data_ptr_cast(&output_num);

	idx_t padded_byte_idx = sizeof(T) - bit.GetSize() + 1;
	output[sizeof(T) - 1 - padded_byte_idx] = GetFirstByte(bit);
	for (idx_t idx = padded_byte_idx + 1; idx < sizeof(T); ++idx) {
		output[sizeof(T) - 1 - idx] = data[1 + idx - padded_byte_idx];
	}
}